

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::raw_node::raw_node(raw_node *this,raw_node *other)

{
  node *pSrc;
  node *pDst;
  raw_node *other_local;
  raw_node *this_local;
  
  if (other->m_bits[0x41] == '\0') {
    this->m_bits[0x41] = '\0';
  }
  else {
    hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
    ::construct_value_type((value_type *)this,(value_type *)other);
    this->m_bits[0x41] = '\x01';
  }
  return;
}

Assistant:

inline raw_node(const raw_node& other)
            {
                node* pDst = reinterpret_cast<node*>(this);
                const node* pSrc = reinterpret_cast<const node*>(&other);

                if (pSrc->state)
                {
                    hash_map_type::construct_value_type(pDst, pSrc);
                    pDst->state = cStateValid;
                }
                else
                {
                    pDst->state = cStateInvalid;
                }
            }